

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result * __thiscall
testing::internal::FunctionMocker<ot::commissioner::Error_(ot::commissioner::Timestamp_&)>::
PerformDefaultAction
          (Result *__return_storage_ptr__,
          FunctionMocker<ot::commissioner::Error_(ot::commissioner::Timestamp_&)> *this,
          ArgumentTuple *args,string *call_description)

{
  OnCallSpec<ot::commissioner::Error_(ot::commissioner::Timestamp_&)> *this_00;
  Action<ot::commissioner::Error_(ot::commissioner::Timestamp_&)> *this_01;
  string message;
  _Head_base<0UL,_ot::commissioner::Timestamp_&,_false> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<ot::commissioner::Error_(ot::commissioner::Timestamp_&)> *)0x0) {
    std::operator+(&local_38,call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    DefaultValue<ot::commissioner::Error>::Get();
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    this_01 = OnCallSpec<ot::commissioner::Error_(ot::commissioner::Timestamp_&)>::GetAction
                        (this_00);
    local_40._M_head_impl =
         (args->super__Tuple_impl<0UL,_ot::commissioner::Timestamp_&>).
         super__Head_base<0UL,_ot::commissioner::Timestamp_&,_false>._M_head_impl;
    Action<ot::commissioner::Error_(ot::commissioner::Timestamp_&)>::Perform
              (__return_storage_ptr__,this_01,(ArgumentTuple *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }